

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O1

void button_binding_ungrab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  ushort uVar1;
  toggle_modifiers *ptVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  ushort *puVar3;
  undefined8 uVar4;
  
  uVar4 = 0x104b90;
  xcb_ungrab_button(state->xcb,binding->button,window,binding->modifiers,in_R8,in_R9,0x104b90);
  ptVar2 = state->button_state->modifiers;
  if (ptVar2 != (toggle_modifiers *)0x0) {
    puVar3 = ptVar2->masks;
    uVar1 = *puVar3;
    while (uVar1 != 0) {
      puVar3 = puVar3 + 1;
      xcb_ungrab_button(state->xcb,binding->button,window,uVar1 | binding->modifiers,in_R8,in_R9,
                        uVar4);
      uVar1 = *puVar3;
    }
  }
  return;
}

Assistant:

void button_binding_ungrab(const struct natwm_state *state, xcb_window_t window,
                           const struct button_binding *binding)
{
        xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; ++mask) {
                xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers | *mask);
        }
}